

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_queue.hpp
# Opt level: O0

void __thiscall
asio::detail::op_queue<asio::detail::scheduler_operation>::~op_queue
          (op_queue<asio::detail::scheduler_operation> *this)

{
  scheduler_operation *o;
  scheduler_operation *op;
  op_queue<asio::detail::scheduler_operation> *this_local;
  
  while (o = this->front_, o != (scheduler_operation *)0x0) {
    pop(this);
    op_queue_access::destroy<asio::detail::scheduler_operation>(o);
  }
  noncopyable::~noncopyable((noncopyable *)this);
  return;
}

Assistant:

~op_queue()
  {
    while (Operation* op = front_)
    {
      pop();
      op_queue_access::destroy(op);
    }
  }